

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeoffsets.cpp
# Opt level: O1

void __thiscall TimeOffsets::Add(TimeOffsets *this,seconds offset)

{
  _Map_pointer ppdVar1;
  _Elt_pointer pdVar2;
  string_view source_file;
  bool bVar3;
  Logger *pLVar4;
  unsigned_long *in_R8;
  long in_FS_OFFSET;
  string_view str;
  string_view logging_function;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock0;
  string log_msg;
  long local_f8;
  rep local_f0;
  duration<long,_std::ratio<1L,_1L>_> local_e8 [2];
  unique_lock<std::mutex> local_d8 [7];
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_d8[0]._M_owns = false;
  local_e8[0].__r = offset.__r;
  local_d8[0]._M_device = (mutex_type *)this;
  std::unique_lock<std::mutex>::lock(local_d8);
  ppdVar1 = (this->m_offsets).
            super__Deque_base<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_node;
  if (0x31 < ((long)(this->m_offsets).
                    super__Deque_base<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_last -
              (long)(this->m_offsets).
                    super__Deque_base<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_cur >> 3) +
             ((long)(this->m_offsets).
                    super__Deque_base<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_cur -
              (long)(this->m_offsets).
                    super__Deque_base<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_first >> 3) +
             ((((ulong)((long)ppdVar1 -
                       (long)(this->m_offsets).
                             super__Deque_base<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                             ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
             (ulong)(ppdVar1 == (_Map_pointer)0x0)) * 0x40) {
    std::
    deque<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
    ::pop_front(&this->m_offsets);
  }
  pdVar2 = (this->m_offsets).
           super__Deque_base<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pdVar2 == (this->m_offsets).
                super__Deque_base<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::
    deque<std::chrono::duration<long,std::ratio<1l,1l>>,std::allocator<std::chrono::duration<long,std::ratio<1l,1l>>>>
    ::_M_push_back_aux<std::chrono::duration<long,std::ratio<1l,1l>>const&>
              ((deque<std::chrono::duration<long,std::ratio<1l,1l>>,std::allocator<std::chrono::duration<long,std::ratio<1l,1l>>>>
                *)&this->m_offsets,local_e8);
  }
  else {
    pdVar2->__r = local_e8[0].__r;
    (this->m_offsets).
    super__Deque_base<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
    ._M_impl.super__Deque_impl_data._M_finish._M_cur = pdVar2 + 1;
  }
  pLVar4 = LogInstance();
  bVar3 = BCLog::Logger::WillLogCategoryLevel(pLVar4,NET,Debug);
  if (bVar3) {
    local_f0 = local_e8[0].__r;
    ppdVar1 = (this->m_offsets).
              super__Deque_base<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node;
    local_f8 = ((long)(this->m_offsets).
                      super__Deque_base<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_last -
                (long)(this->m_offsets).
                      super__Deque_base<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_cur >> 3) +
               ((long)(this->m_offsets).
                      super__Deque_base<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                (long)(this->m_offsets).
                      super__Deque_base<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_first >> 3) +
               ((((ulong)((long)ppdVar1 -
                         (long)(this->m_offsets).
                               super__Deque_base<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                               ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
               (ulong)(ppdVar1 == (_Map_pointer)0x0)) * 0x40;
    pLVar4 = LogInstance();
    bVar3 = BCLog::Logger::Enabled(pLVar4);
    if (bVar3) {
      local_48._M_string_length = 0;
      local_48.field_2._M_local_buf[0] = '\0';
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      tinyformat::format<long,unsigned_long>
                (&local_68,(tinyformat *)"Added time offset %+ds, total samples %d\n",
                 (char *)&local_f0,&local_f8,in_R8);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&local_48,&local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
      pLVar4 = LogInstance();
      local_68._M_dataplus._M_p = (pointer)0x5d;
      local_68._M_string_length = 0x82f39b;
      source_file._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/timeoffsets.cpp"
      ;
      source_file._M_len = 0x5d;
      str._M_str = local_48._M_dataplus._M_p;
      str._M_len = local_48._M_string_length;
      logging_function._M_str = "Add";
      logging_function._M_len = 3;
      BCLog::Logger::LogPrintStr(pLVar4,str,logging_function,source_file,0x1f,NET,Debug);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,
                        CONCAT71(local_48.field_2._M_allocated_capacity._1_7_,
                                 local_48.field_2._M_local_buf[0]) + 1);
      }
    }
  }
  std::unique_lock<std::mutex>::~unique_lock(local_d8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void TimeOffsets::Add(std::chrono::seconds offset)
{
    LOCK(m_mutex);

    if (m_offsets.size() >= MAX_SIZE) {
        m_offsets.pop_front();
    }
    m_offsets.push_back(offset);
    LogDebug(BCLog::NET, "Added time offset %+ds, total samples %d\n",
             Ticks<std::chrono::seconds>(offset), m_offsets.size());
}